

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ** __thiscall ImGuiStorage::GetVoidPtrRef(ImGuiStorage *this,ImGuiID key,void *default_val)

{
  const_iterator it_00;
  iterator pvVar1;
  iterator pvVar2;
  Pair local_38;
  const_iterator local_28;
  iterator it;
  void *default_val_local;
  ImGuiStorage *pIStack_10;
  ImGuiID key_local;
  ImGuiStorage *this_local;
  
  it = (iterator)default_val;
  default_val_local._4_4_ = key;
  pIStack_10 = this;
  pvVar1 = LowerBound(&this->Data,key);
  local_28 = pvVar1;
  pvVar2 = ImVector<ImGuiStorage::Pair>::end(&this->Data);
  it_00 = local_28;
  if ((pvVar1 == pvVar2) || (local_28->key != default_val_local._4_4_)) {
    Pair::Pair(&local_38,default_val_local._4_4_,it);
    local_28 = ImVector<ImGuiStorage::Pair>::insert(&this->Data,it_00,&local_38);
  }
  return (void **)&local_28->field_1;
}

Assistant:

void** ImGuiStorage::GetVoidPtrRef(ImGuiID key, void* default_val)
{
    ImVector<Pair>::iterator it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
        it = Data.insert(it, Pair(key, default_val));
    return &it->val_p;
}